

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerMSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t physical_type_id,bool is_packed,bool relaxed)

{
  bool bVar1;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  string local_a0 [32];
  string local_80 [48];
  string local_50;
  byte local_2e;
  byte local_2d;
  uint32_t local_2c;
  bool relaxed_local;
  bool is_packed_local;
  SPIRType *pSStack_28;
  uint32_t physical_type_id_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerMSL *this_local;
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,physical_type_id);
  local_2e = relaxed;
  local_2d = is_packed;
  local_2c = physical_type_id;
  pSStack_28 = exp_type;
  exp_type_local = (SPIRType *)exp_str;
  exp_str_local = (string *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  bVar1 = Compiler::is_matrix((Compiler *)this,exp_type);
  if (bVar1) {
    CompilerGLSL::strip_enclosed_expression(&this->super_CompilerGLSL,exp_str);
    if ((local_2c != 0) || ((local_2d & 1) != 0)) {
      ::std::__cxx11::string::string(local_a0,(string *)exp_str);
      ts_2 = (char (*) [2])(ulong)local_2c;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x24])
                (local_80,this,local_a0,pSStack_28,ts_2,(ulong)(local_2d & 1),1);
      ::std::__cxx11::string::operator=((string *)exp_str,local_80);
      ::std::__cxx11::string::~string(local_80);
      ::std::__cxx11::string::~string(local_a0);
    }
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x59e4a1,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b7d4b,ts_2);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_50,(string *)exp_str);
    CompilerGLSL::convert_row_major_matrix
              (__return_storage_ptr__,&this->super_CompilerGLSL,&local_50,pSStack_28,local_2c,
               (bool)(local_2d & 1),(bool)(local_2e & 1));
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t physical_type_id,
                                             bool is_packed, bool relaxed)
{
	if (!is_matrix(exp_type))
	{
		return CompilerGLSL::convert_row_major_matrix(std::move(exp_str), exp_type, physical_type_id, is_packed, relaxed);
	}
	else
	{
		strip_enclosed_expression(exp_str);
		if (physical_type_id != 0 || is_packed)
			exp_str = unpack_expression_type(exp_str, exp_type, physical_type_id, is_packed, true);
		return join("transpose(", exp_str, ")");
	}
}